

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dm_tools.cxx
# Opt level: O2

void __thiscall dm_tools::process(dm_tools *this,cl_parser *cl)

{
  char *path;
  bool bVar1;
  target_format tVar2;
  xr_dm *this_00;
  size_t sVar3;
  long lVar4;
  
  tVar2 = object_tools::get_target_format(&this->super_object_tools,cl);
  if ((TARGET_OBJECT < tVar2) ||
     ((0x10003U >> (tVar2 & (TARGET_OBJECT|TARGET_BONES|TARGET_SKLS|TARGET_SKL|TARGET_INFO)) & 1) ==
      0)) {
    xray_re::msg("unsupported options combination");
    return;
  }
  bVar1 = batch_helper::prepare_target_name(&(this->super_object_tools).super_batch_helper,cl);
  if (bVar1) {
    sVar3 = cl->m_num_params;
    lVar4 = -0x18;
    while (bVar1 = sVar3 != 0, sVar3 = sVar3 - 1, bVar1) {
      path = *(char **)((long)&cl->m_options[cl->m_argc].name + lVar4);
      this_00 = (xr_dm *)operator_new(0x250);
      xray_re::xr_dm::xr_dm(this_00);
      bVar1 = xray_re::xr_dm::load_dm(this_00,path);
      if (bVar1) {
        if (tVar2 == TARGET_DEFAULT) {
LAB_001209fc:
          object_tools::save_object(&this->super_object_tools,(xr_object *)this_00,path,SOC);
        }
        else if (tVar2 == TARGET_INFO) {
          xray_re::msg("shader: %s",(this_00->m_shader)._M_dataplus._M_p);
          xray_re::msg("texture: %s",(this_00->m_texture)._M_dataplus._M_p);
          xray_re::msg("scale (min/max): %f/%f",(double)this_00->m_min_scale,
                       (double)this_00->m_max_scale);
          xray_re::msg("flags: %8.8x",(ulong)this_00->m_flags);
        }
        else if (tVar2 == TARGET_OBJECT) goto LAB_001209fc;
      }
      else {
        xray_re::msg("can\'t load %s",path);
      }
      (*(this_00->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[1])(this_00);
      lVar4 = lVar4 + -0x18;
    }
  }
  return;
}

Assistant:

void dm_tools::process(const cl_parser& cl)
{
	target_format format = get_target_format(cl);
	switch (format) {
	case TARGET_DEFAULT:
	case TARGET_INFO:
	case TARGET_OBJECT:
		break;
	default:
		msg("unsupported options combination");
		return;
	}

	if (!prepare_target_name(cl))
		return;

	for (size_t i = 0, num_params = cl.num_params(); i != num_params; ++i) {
		const char* source = cl.param(i);
		xr_dm* dm = new xr_dm;
		if (dm->load_dm(source)) {
			switch (format) {
			case TARGET_DEFAULT:
			case TARGET_OBJECT:
				save_object(*dm, source, xr_sg_type::SOC);
				break;
			case TARGET_INFO:
				msg("shader: %s", dm->shader().c_str());
				msg("texture: %s", dm->texture().c_str());
				msg("scale (min/max): %f/%f", dm->min_scale(), dm->max_scale());
				msg("flags: %8.8" PRIx32, dm->flags());
				break;
			default:
				break;
			}
		} else {
			msg("can't load %s", source);
		}
		delete dm;
	}
}